

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O1

bool __thiscall
llvm::ConvertUTF8toWide
          (llvm *this,uint WideCharWidth,StringRef Source,char **ResultPtr,UTF8 **ErrorPtr)

{
  Boolean BVar1;
  ConversionResult CVar2;
  long *plVar3;
  char *__n;
  undefined4 in_register_00000034;
  UTF8 *__src;
  int iVar4;
  UTF8 *sourceStart;
  UTF32 *targetStart;
  UTF8 *local_30;
  UTF32 *local_28;
  
  __src = (UTF8 *)CONCAT44(in_register_00000034,WideCharWidth);
  plVar3 = (long *)Source.Length;
  __n = Source.Data;
  iVar4 = (int)this;
  local_30 = __src;
  if (iVar4 == 1) {
    BVar1 = isLegalUTF8String(&local_30,__src + (long)__n);
    if (BVar1 == '\0') {
      *ResultPtr = (char *)local_30;
      CVar2 = sourceIllegal;
    }
    else {
      memcpy((void *)*plVar3,__src,(size_t)__n);
      *plVar3 = (long)(__n + *plVar3);
      CVar2 = conversionOK;
    }
  }
  else {
    if (iVar4 == 2) {
      local_28 = (UTF32 *)*plVar3;
      CVar2 = ConvertUTF8toUTF16(&local_30,__src + (long)__n,(UTF16 **)&local_28,
                                 (UTF16 *)((long)local_28 + (long)__n * 2),strictConversion);
    }
    else {
      if (iVar4 != 4) {
        __assert_fail("WideCharWidth == 1 || WideCharWidth == 2 || WideCharWidth == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTFWrapper.cpp"
                      ,0x16,
                      "bool llvm::ConvertUTF8toWide(unsigned int, llvm::StringRef, char *&, const UTF8 *&)"
                     );
      }
      local_28 = (UTF32 *)*plVar3;
      CVar2 = ConvertUTF8toUTF32(&local_30,__src + (long)__n,&local_28,local_28 + (long)__n,
                                 strictConversion);
    }
    if (CVar2 == conversionOK) {
      *plVar3 = (long)local_28;
    }
    else {
      *ResultPtr = (char *)local_30;
    }
  }
  if (CVar2 != targetExhausted) {
    return CVar2 == conversionOK;
  }
  __assert_fail("(result != targetExhausted) && \"ConvertUTF8toUTFXX exhausted target buffer\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTFWrapper.cpp"
                ,0x3e,
                "bool llvm::ConvertUTF8toWide(unsigned int, llvm::StringRef, char *&, const UTF8 *&)"
               );
}

Assistant:

bool ConvertUTF8toWide(unsigned WideCharWidth, llvm::StringRef Source,
                       char *&ResultPtr, const UTF8 *&ErrorPtr) {
  assert(WideCharWidth == 1 || WideCharWidth == 2 || WideCharWidth == 4);
  ConversionResult result = conversionOK;
  // Copy the character span over.
  if (WideCharWidth == 1) {
    const UTF8 *Pos = reinterpret_cast<const UTF8*>(Source.begin());
    if (!isLegalUTF8String(&Pos, reinterpret_cast<const UTF8*>(Source.end()))) {
      result = sourceIllegal;
      ErrorPtr = Pos;
    } else {
      memcpy(ResultPtr, Source.data(), Source.size());
      ResultPtr += Source.size();
    }
  } else if (WideCharWidth == 2) {
    const UTF8 *sourceStart = (const UTF8*)Source.data();
    // FIXME: Make the type of the result buffer correct instead of
    // using reinterpret_cast.
    UTF16 *targetStart = reinterpret_cast<UTF16*>(ResultPtr);
    ConversionFlags flags = strictConversion;
    result = ConvertUTF8toUTF16(
        &sourceStart, sourceStart + Source.size(),
        &targetStart, targetStart + Source.size(), flags);
    if (result == conversionOK)
      ResultPtr = reinterpret_cast<char*>(targetStart);
    else
      ErrorPtr = sourceStart;
  } else if (WideCharWidth == 4) {
    const UTF8 *sourceStart = (const UTF8*)Source.data();
    // FIXME: Make the type of the result buffer correct instead of
    // using reinterpret_cast.
    UTF32 *targetStart = reinterpret_cast<UTF32*>(ResultPtr);
    ConversionFlags flags = strictConversion;
    result = ConvertUTF8toUTF32(
        &sourceStart, sourceStart + Source.size(),
        &targetStart, targetStart + Source.size(), flags);
    if (result == conversionOK)
      ResultPtr = reinterpret_cast<char*>(targetStart);
    else
      ErrorPtr = sourceStart;
  }
  assert((result != targetExhausted)
         && "ConvertUTF8toUTFXX exhausted target buffer");
  return result == conversionOK;
}